

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O0

int run_test_condvar_4(void)

{
  int iVar1;
  uv_thread_t local_c8;
  uv_thread_t thread;
  worker_config_conflict wc;
  
  worker_config_init((worker_config_conflict *)&thread,1,condvar_signal,condvar_timedwait);
  iVar1 = uv_thread_create(&local_c8,worker,&thread);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-condvar.c"
            ,0xd8,"0 == uv_thread_create(&thread, worker, &wc)");
    abort();
  }
  (*wc.signal_cond)((worker_config_conflict *)&thread,(int *)(wc.cond.__size + 0x2c));
  (*(code *)wc._160_8_)(&thread,&wc.use_broadcast);
  iVar1 = uv_thread_join(&local_c8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-condvar.c"
            ,0xde,"0 == uv_thread_join(&thread)");
    abort();
  }
  worker_config_destroy((worker_config_conflict *)&thread);
  return 0;
}

Assistant:

TEST_IMPL(condvar_4) {
  worker_config wc;
  uv_thread_t thread;

  /* Helper to signal-then-wait. */
  worker_config_init(&wc, 1, condvar_signal, condvar_timedwait);
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  /* We wait-then-signal. */
  wc.wait_cond(&wc, &wc.posted_1);
  wc.signal_cond(&wc, &wc.posted_2);

  ASSERT(0 == uv_thread_join(&thread));
  worker_config_destroy(&wc);

  return 0;
}